

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint-c.cpp
# Opt level: O1

duckdb_hugeint duckdb_double_to_hugeint(double val)

{
  duckdb_hugeint dVar1;
  bool bVar2;
  hugeint_t local_18;
  double local_8;
  
  local_8 = val;
  bVar2 = duckdb::Value::DoubleIsFinite(val);
  if (bVar2) {
    bVar2 = duckdb::Hugeint::TryConvert<double>(local_8,&local_18);
    if (bVar2) goto LAB_01603597;
  }
  local_18.lower = 0;
  local_18.upper = 0;
LAB_01603597:
  dVar1.upper = local_18.upper;
  dVar1.lower = local_18.lower;
  return dVar1;
}

Assistant:

duckdb_hugeint duckdb_double_to_hugeint(double val) {
	hugeint_t internal_result;
	if (!Value::DoubleIsFinite(val) || !Hugeint::TryConvert<double>(val, internal_result)) {
		internal_result.lower = 0;
		internal_result.upper = 0;
	}

	duckdb_hugeint result;
	result.lower = internal_result.lower;
	result.upper = internal_result.upper;
	return result;
}